

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-cast-registerer.cpp
# Opt level: O2

void __thiscall custom_vector_registerer::test_method(custom_vector_registerer *this)

{
  size_t sVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long i;
  bool local_779;
  char *local_778;
  char *local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  Vector v;
  undefined **local_738;
  undefined1 local_730;
  undefined8 *local_728;
  char **local_720;
  bool local_718 [16];
  shared_count local_708;
  char *local_700;
  char *local_6f8;
  long local_6f0;
  long local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  string local_6b0;
  output_test_stream output;
  Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> myVectorSignal;
  output_test_stream output_1;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  ostringstream os;
  shared_count local_278 [45];
  format fmt;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"vector",(allocator<char> *)&output);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::Signal
            (&myVectorSignal,&local_6b0);
  std::__cxx11::string::~string((string *)&local_6b0);
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_298,1);
  (*myVectorSignal.super_SignalBase<int>._vptr_SignalBase[0x15])(&myVectorSignal,&output);
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a8,0x56);
  local_2c8 = "Sig:vector (Type Cst)";
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("Sig:vector (Type Cst)");
  local_2c0 = "Sig:vector (Type Cst)" + sVar1;
  boost::test_tools::output_test_stream::is_equal(&os,&output,&local_2c8,1);
  fmt.items_.
  super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c295;
  fmt.items_.
  super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x124329;
  _output_1 = &PTR__lazy_ostream_0012fab8;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
  ;
  local_2d0 = "";
  boost::test_tools::tt_detail::report_assertion(&os,&output_1,&local_2d8,0x56,1,0,0);
  boost::detail::shared_count::~shared_count(local_278);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  for (i = 0; i != 5; i = i + 1) {
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Unit((BasisReturnType *)&output,5,i)
    ;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&v,
               (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>_>
                *)&output);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    Eigen::operator<<((ostream *)&os,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v);
    std::__cxx11::stringbuf::str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fmt,"[5](",
                   &local_768);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fmt,")");
    std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&output_1,_S_in);
    std::__cxx11::string::~string((string *)&output_1);
    std::__cxx11::string::~string((string *)&fmt);
    std::__cxx11::string::~string((string *)&local_768);
    dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
              (&myVectorSignal,(istringstream *)&output);
    local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::test_tools::output_test_stream::output_test_stream(&output_1,&local_6c0,1);
    dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::get
              (&myVectorSignal,(ostream *)&output_1);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&fmt,"%d %d %d %d %d");
    local_768._M_dataplus._M_p._0_1_ = i == 0;
    pbVar2 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,bool_const&>
                       (&fmt,(bool *)&local_768);
    local_738 = (undefined **)CONCAT71(local_738._1_7_,i == 1);
    pbVar2 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,bool_const&>
                       (pbVar2,(bool *)&local_738);
    local_718[0] = i == 2;
    pbVar2 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,bool_const&>
                       (pbVar2,local_718);
    local_778 = (char *)CONCAT71(local_778._1_7_,i == 3);
    pbVar2 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,bool_const&>
                       (pbVar2,(bool *)&local_778);
    local_779 = i == 4;
    boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,bool_const&>
              (pbVar2,&local_779);
    local_6d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
    ;
    local_6c8 = "";
    local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6d0,0x69,&local_6e0);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_768,&fmt);
    local_6f0 = CONCAT71(local_768._M_dataplus._M_p._1_7_,local_768._M_dataplus._M_p._0_1_);
    local_6e8 = local_6f0 + local_768._M_string_length;
    boost::test_tools::output_test_stream::is_equal
              (local_718,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_1,
               &local_6f0,1);
    local_778 = "output.is_equal(fmt.str())";
    local_770 = "";
    local_730 = 0;
    local_738 = &PTR__lazy_ostream_0012fab8;
    local_728 = &boost::unit_test::lazy_ostream::inst;
    local_720 = &local_778;
    local_700 = 
    "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
    ;
    local_6f8 = "";
    boost::test_tools::tt_detail::report_assertion(local_718,&local_738,&local_700,0x69,1,0,0);
    boost::detail::shared_count::~shared_count(&local_708);
    std::__cxx11::string::~string((string *)&local_768);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(&fmt);
    boost::test_tools::output_test_stream::~output_test_stream(&output_1);
    std::__cxx11::istringstream::~istringstream((istringstream *)&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_1,"test",(allocator<char> *)&os);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&output_1,_S_in);
  std::__cxx11::string::~string((string *)&output_1);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            (&myVectorSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_1,"[test",(allocator<char> *)&os);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&output_1,_S_in);
  std::__cxx11::string::~string((string *)&output_1);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            (&myVectorSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_1,"[5[",(allocator<char> *)&os);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&output_1,_S_in);
  std::__cxx11::string::~string((string *)&output_1);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            (&myVectorSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_1,"[5]test",(allocator<char> *)&os);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&output_1,_S_in);
  std::__cxx11::string::~string((string *)&output_1);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            (&myVectorSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_1,"[5](1, ",(allocator<char> *)&os);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&output_1,_S_in);
  std::__cxx11::string::~string((string *)&output_1);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            (&myVectorSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_1,"[5](1,2,3,4,5]",(allocator<char> *)&os);
  std::__cxx11::istringstream::istringstream((istringstream *)&output,(string *)&output_1,_S_in);
  std::__cxx11::string::~string((string *)&output_1);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            (&myVectorSignal,(istringstream *)&output);
  std::__cxx11::istringstream::~istringstream((istringstream *)&output);
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_2e8,1);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::trace
            (&myVectorSignal,(ostream *)&output);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::~Signal(&myVectorSignal);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(custom_vector_registerer) {
  dynamicgraph::Signal<dynamicgraph::Vector, int> myVectorSignal("vector");

  // Print the signal name.
  {
    output_test_stream output;
    output << myVectorSignal;
    BOOST_CHECK(output.is_equal("Sig:vector (Type Cst)"));
  }

  for (unsigned int i = 0; i < 5; ++i) {
    Vector v = Vector::Unit(5, i);
    std::ostringstream os;
    os << v;
    std::istringstream ss("[5](" + os.str() + ")");

    // Set signal value.
    myVectorSignal.set(ss);

    // Print out signal value.
    output_test_stream output;
    myVectorSignal.get(output);

    boost::format fmt("%d %d %d %d %d");
    fmt % (i == 0) % (i == 1) % (i == 2) % (i == 3) % (i == 4);

    BOOST_CHECK(output.is_equal(fmt.str()));
  }

  // Catch Exception of ss (not good input)

  // ss[0] != "["
  try {
    std::istringstream ss("test");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[0] != \"[\"";
  }

  // ss[1] != %i
  try {
    std::istringstream ss("[test");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[1] != %i";
  }

  // ss[2] != "]"
  try {
    std::istringstream ss("[5[");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[2] != \"]\"";
  }

  // ss[3] != "("
  try {
    std::istringstream ss("[5]test");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[3] != \"(\"";
  }

  // ss[4] != ' ' || ','
  try {
    std::istringstream ss("[5](1, ");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[4] != \" \" || \",\"";
  }

  // ss[-1] != ")"
  try {
    std::istringstream ss("[5](1,2,3,4,5]");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[-1] != \")\"";
  }

  try {
    output_test_stream output;
    myVectorSignal.trace(output);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[-1] != \")\"";
  }
}